

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

char * NULLCString::strcpy(char *__dest,char *__src)

{
  char *in_RAX;
  uint in_ECX;
  long in_RDX;
  char *error;
  bool bVar1;
  
  if (__dest == (char *)0x0) {
    error = "destination string is null";
  }
  else if (in_RDX == 0) {
    error = "source string is null";
  }
  else {
    bVar1 = in_ECX != 0;
    if (bVar1) {
      in_RAX = (char *)0x0;
      do {
        if ((int)__src == (int)in_RAX) {
          nullcThrowError("buffer overflow");
          in_RAX = (char *)0xffffffff;
          break;
        }
        if (in_RAX[in_RDX] == '\0') {
          __dest[(long)in_RAX] = '\0';
          break;
        }
        __dest[(long)in_RAX] = in_RAX[in_RDX];
        in_RAX = in_RAX + 1;
        bVar1 = (uint)in_RAX < in_ECX;
      } while (in_ECX != (uint)in_RAX);
    }
    if (bVar1) {
      return in_RAX;
    }
    error = "string is not null-terminated";
  }
  nullcThrowError(error);
  return (char *)0xffffffff;
}

Assistant:

int strcpy(NULLCArray dst, NULLCArray src)
	{
		if(!dst.ptr)
		{
			nullcThrowError("destination string is null");
			return -1;
		}

		if(!src.ptr)
		{
			nullcThrowError("source string is null");
			return -1;
		}

		for(unsigned i = 0; i < src.len; i++)
		{
			if(i >= dst.len)
			{
				nullcThrowError("buffer overflow");
				return -1;
			}

			if(!src.ptr[i])
			{
				dst.ptr[i] = 0;

				return i;
			}
			else
			{
				dst.ptr[i] = src.ptr[i];
			}
		}

		nullcThrowError("string is not null-terminated");
		return -1;
	}